

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O1

int __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::stat
          (summary_impl<unsigned_int,_6UL> *this,char *__file,stat *__buf)

{
  ushort uVar1;
  data_t *this_00;
  data_t *this_01;
  void *pvVar2;
  long lVar3;
  ushort uVar4;
  long *in_RCX;
  double *pdVar5;
  byte bVar6;
  iterator __position;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  float v;
  unsigned_long local_b0;
  int local_a4;
  long *local_a0;
  undefined1 local_98 [24];
  undefined1 auStack_80 [32];
  uint local_60;
  double *local_50;
  double local_48;
  double dStack_40;
  
  refresh((summary_impl<unsigned_int,_6UL> *)__file);
  *in_RCX = 0;
  __buf->st_dev = 0;
  auStack_80._24_4_ = 0;
  auStack_80._28_4_ = 0;
  auStack_80._8_8_ = (pointer)0x0;
  auStack_80._16_8_ = (pointer)0x0;
  local_98._16_8_ = (pointer)0x0;
  auStack_80._0_8_ = (pointer)0x0;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  this_00 = *(data_t **)(__file + 0x18);
  this_01 = *(data_t **)(__file + 0x20);
  local_a0 = in_RCX;
  if (this_01 == (data_t *)0x0 && this_00 == (data_t *)0x0) {
    local_b0 = local_b0 & 0xffffffff00000000;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this,
               (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3,
               (value_type_conflict4 *)&local_b0,(allocator_type *)&local_a4);
  }
  else {
    if (this_00 != (data_t *)0x0) {
      data_t::stat(this_00,(char *)in_RCX,(stat *)local_98);
    }
    if (this_01 != (data_t *)0x0) {
      data_t::stat(this_01,(char *)local_a0,(stat *)auStack_80);
    }
  }
  if (this_01 != (data_t *)0x0 || this_00 != (data_t *)0x0) {
    if (*local_a0 == 0) {
      local_b0 = local_b0 & 0xffffffff00000000;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)this,
                 (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3,
                 (value_type_conflict4 *)&local_b0,(allocator_type *)&local_a4);
    }
    else {
      local_b0 = 0x2000;
      local_a4 = 0;
      std::vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>
                  *)local_98,&local_b0,&local_a4);
      local_b0 = 0x2000;
      local_a4 = 0;
      std::vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,unsigned_int>,std::allocator<std::pair<short,unsigned_int>>>
                  *)auStack_80,&local_b0,&local_a4);
      bVar6 = -(*(short *)local_98._0_8_ < *(short *)auStack_80._0_8_) | 1;
      if ((*(short *)local_98._0_8_ == *(short *)auStack_80._0_8_) &&
         (bVar6 = -(*(uint *)(local_98._0_8_ + 4) < *(uint *)(auStack_80._0_8_ + 4)) | 1,
         *(uint *)(local_98._0_8_ + 4) == *(uint *)(auStack_80._0_8_ + 4))) {
        bVar6 = 0;
      }
      local_60 = (uint)('\0' < (char)bVar6);
      (this->refresh_time_).__r = 0;
      (this->tp_).super___atomic_base<unsigned_long>._M_i = 0;
      this->rate_ = (vector<double,_std::allocator<double>_> *)0x0;
      std::vector<float,_std::allocator<float>_>::reserve
                ((vector<float,_std::allocator<float>_> *)this,
                 (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3);
      local_b0 = CONCAT44(local_b0._4_4_,0xdf800000);
      pdVar5 = (double *)**(undefined8 **)(__file + 0x10);
      local_50 = (double *)(*(undefined8 **)(__file + 0x10))[1];
      if (pdVar5 != local_50) {
        lVar7 = 0;
        do {
          dVar8 = *pdVar5;
          if (0.0 <= dVar8) {
            uVar11 = 0x3ff0000000000000;
            if (1.0 < dVar8) {
              dVar8 = 1.0;
            }
            lVar3 = *local_a0;
            if (lVar3 == 0) {
              uVar11 = 0;
            }
            auVar12._8_4_ = (int)((ulong)lVar3 >> 0x20);
            auVar12._0_8_ = lVar3;
            auVar12._12_4_ = 0x45300000;
            dStack_40 = auVar12._8_8_ - 1.9342813113834067e+25;
            dVar13 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
            if (dVar8 * dVar13 <= dVar13) {
              dVar13 = dVar8 * dVar13;
            }
            local_48 = (double)(-(ulong)(dVar8 == 0.0) & uVar11 |
                               ~-(ulong)(dVar8 == 0.0) & (ulong)dVar13);
            auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar9._0_8_ = lVar7;
            auVar9._12_4_ = 0x45300000;
            if ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) < local_48) {
              do {
                uVar11 = (ulong)*(uint *)(*(long *)(local_98 + (long)(int)local_60 * 0x18) + 4 +
                                         (long)*(int *)(auStack_80 + (long)(int)local_60 * 4 + 0x18)
                                         * 8);
                uVar1 = (ushort)*(undefined4 *)
                                 (*(long *)(local_98 + (long)(int)local_60 * 0x18) +
                                 (long)*(int *)(auStack_80 + (long)(int)local_60 * 4 + 0x18) * 8);
                uVar4 = 0x1fff - uVar1;
                if (-1 < (short)uVar1) {
                  uVar4 = uVar1;
                }
                lVar7 = lVar7 + uVar11;
                local_b0 = CONCAT44(local_b0._4_4_,
                                    *(float *)(summary_impl<unsigned_int,6ul>::get_decode_table()::
                                               table + (ulong)uVar4 * 4));
                __buf->st_dev =
                     (__dev_t)((double)((float)uVar11 *
                                       *(float *)(summary_impl<unsigned_int,6ul>::get_decode_table()
                                                  ::table + (ulong)uVar4 * 4)) +
                              (double)__buf->st_dev);
                data_copy_t::inc((data_copy_t *)local_98);
                auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
                auVar10._0_8_ = lVar7;
                auVar10._12_4_ = 0x45300000;
              } while ((auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) < local_48);
            }
            __position._M_current = (float *)(this->tp_).super___atomic_base<unsigned_long>._M_i;
            if ((vector<double,_std::allocator<double>_> *)__position._M_current != this->rate_)
            goto LAB_00197b60;
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)this,__position,(float *)&local_b0);
          }
          else {
            __position._M_current = (float *)(this->tp_).super___atomic_base<unsigned_long>._M_i;
            if ((vector<double,_std::allocator<double>_> *)__position._M_current == this->rate_) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this,__position,(float *)&local_b0);
            }
            else {
LAB_00197b60:
              *__position._M_current = (float)local_b0;
              (this->tp_).super___atomic_base<unsigned_long>._M_i =
                   (__int_type_conflict)(__position._M_current + 1);
            }
          }
          pdVar5 = pdVar5 + 1;
        } while (pdVar5 != local_50);
      }
      lVar3 = (long)*(int *)(auStack_80 + (long)(int)local_60 * 4 + 0x18);
      lVar7 = *(long *)(local_98 + (long)(int)local_60 * 0x18);
      uVar1 = *(ushort *)(lVar7 + lVar3 * 8);
      if (uVar1 < 0x2000) {
        do {
          __buf->st_dev =
               (__dev_t)((double)((float)*(uint *)(lVar7 + 4 + lVar3 * 8) *
                                 *(float *)(summary_impl<unsigned_int,6ul>::get_decode_table()::
                                            table + (ulong)uVar1 * 4)) + (double)__buf->st_dev);
          data_copy_t::inc((data_copy_t *)local_98);
          lVar3 = (long)*(int *)(auStack_80 + (long)(int)local_60 * 4 + 0x18);
          lVar7 = *(long *)(local_98 + (long)(int)local_60 * 0x18);
          uVar1 = *(ushort *)(lVar7 + lVar3 * 8);
        } while (uVar1 < 0x2000);
      }
    }
  }
  lVar7 = 0x30;
  do {
    pvVar2 = *(void **)((long)&local_b0 + lVar7);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&local_a0 + lVar7) - (long)pvVar2);
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != 0);
  return (int)this;
}

Assistant:

std::vector<float> stat(double& sum, uint64_t& count) {
    refresh();
    count = 0;
    sum = 0;
    data_copy_t data_copy;
    {
      data_t* ar[2] = {data_[0], data_[1]};
      if (ar[0] == nullptr && ar[1] == nullptr) [[unlikely]] {
        return std::vector<float>(rate_.size(), 0.0f);
      }
      if (ar[0]) {
        ar[0]->stat(count, data_copy.arr[0]);
      }
      if (ar[1]) {
        ar[1]->stat(count, data_copy.arr[1]);
      }
    }
    if (count == 0) {
      return std::vector<float>(rate_.size(), 0);
    }
    uint64_t count_now = 0;
    data_copy.arr[0].emplace_back(bucket_size / 2, 0);
    data_copy.arr[1].emplace_back(bucket_size / 2, 0);
    data_copy.init();
    std::vector<float> result;
    result.reserve(rate_.size());
    float v = -float16_max;
    for (double e : rate_) {
      if (std::isnan(e) || e < 0) {
        result.push_back(v);
        continue;
      }
      else if (e > 1) [[unlikely]] {
        e = 1;
      }
      auto target_count = std::min<double>(e * count, count);
      if (e == 0) {
        target_count = std::min(uint64_t{1}, count);
      }
      while (true) {
        if (target_count <= count_now) [[unlikely]] {
          result.push_back(v);
          break;
        }
        auto tmp = data_copy.count();
        count_now += tmp;
        v = decode(data_t::get_raw_index(data_copy.value()));
        sum += v * tmp;
        data_copy.inc();
      }
    }
    while (data_copy.value() < bucket_size / 2) {
      sum +=
          decode(data_t::get_raw_index(data_copy.value())) * data_copy.count();
      data_copy.inc();
    }
    return result;
  }